

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_psx_NetworkAdapterEnumerator.cpp
# Opt level: O3

void axl::io::NetworkAdapterEnumerator::setupAdapter
               (NetworkAdapterDesc *adapter,ifaddrs *iface,Socket *socket)

{
  uint uVar1;
  int iVar2;
  NetworkAdapterType NVar3;
  ifreq req;
  char acStack_48 [18];
  undefined4 local_36;
  undefined2 local_32;
  
  uVar1 = iface->ifa_flags;
  NVar3 = NetworkAdapterType_Loopback;
  if ((uVar1 & 8) == 0) {
    NVar3 = ((uVar1 & 0x10) >> 3) + NetworkAdapterType_Ethernet;
  }
  adapter->m_type = NVar3;
  uVar1 = uVar1 * 2 & 4;
  adapter->m_flags = uVar1;
  if ((iface->ifa_flags & 0x1000) != 0) {
    adapter->m_flags = uVar1 | 8;
  }
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
            (&adapter->m_name,(EVP_PKEY_CTX *)iface->ifa_name,(EVP_PKEY_CTX *)0xffffffffffffffff);
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
            (&adapter->m_description,(EVP_PKEY_CTX *)iface->ifa_name,
             (EVP_PKEY_CTX *)0xffffffffffffffff);
  iVar2 = (socket->super_File).super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.
          m_h;
  if (iVar2 != -1) {
    strncpy(acStack_48,iface->ifa_name,0x10);
    iVar2 = ioctl(iVar2,0x8927,acStack_48);
    if (iVar2 == -1) {
      err::setLastSystemError();
    }
    else if (-1 < iVar2) {
      *(undefined2 *)(adapter->m_macAddress + 4) = local_32;
      *(undefined4 *)adapter->m_macAddress = local_36;
    }
  }
  return;
}

Assistant:

void
NetworkAdapterEnumerator::setupAdapter(
	NetworkAdapterDesc* adapter,
	ifaddrs* iface,
	io::psx::Socket* socket
) {
	adapter->m_type =
		(iface->ifa_flags & IFF_LOOPBACK) ? NetworkAdapterType_Loopback :
		(iface->ifa_flags & IFF_POINTOPOINT) ? NetworkAdapterType_Ppp :
		NetworkAdapterType_Ethernet;

	adapter->m_flags = 0;

	if (iface->ifa_flags & IFF_BROADCAST)
		adapter->m_flags |= NetworkAdapterFlag_Broadcast;

	if (iface->ifa_flags & IFF_MULTICAST)
		adapter->m_flags |= NetworkAdapterFlag_Multicast;

	adapter->m_name = iface->ifa_name;
	adapter->m_description = iface->ifa_name; // no special description

#if (_AXL_IO_USE_SIOCGIFHWADDR)
	if (socket->isOpen()) { // try to get MAC-address
		ifreq req;
		strncpy(req.ifr_name, iface->ifa_name, countof(req.ifr_name));
		int result = socket->ioctl(SIOCGIFHWADDR, &req);
		if (result >= 0)
			memcpy(adapter->m_macAddress, req.ifr_ifru.ifru_hwaddr.sa_data, sizeof(adapter->m_macAddress));
	}
#endif
}